

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_id.cc
# Opt level: O0

ID * ID::NewAnonymousID(string *prefix)

{
  ID *pIVar1;
  undefined8 uVar2;
  string *in_RDI;
  ID *unaff_retaddr;
  ID *id;
  string local_30 [40];
  
  pIVar1 = (ID *)operator_new(0x78);
  uVar2 = std::__cxx11::string::c_str();
  anonymous_id_seq = anonymous_id_seq + 1;
  strfmt_abi_cxx11_((char *)local_30,"%s%03d",uVar2);
  ID(unaff_retaddr,in_RDI);
  std::__cxx11::string::~string(local_30);
  pIVar1->anonymous_id_ = true;
  return pIVar1;
}

Assistant:

ID* ID::NewAnonymousID(const string& prefix)
	{
	ID* id = new ID(strfmt("%s%03d", prefix.c_str(), ++anonymous_id_seq));
	id->anonymous_id_ = true;
	return id;
	}